

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  XmlFormatting fmt;
  element_type *peVar2;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement e;
  SectionStats *sectionStats_local;
  XmlReporter *this_local;
  
  e._8_8_ = sectionStats;
  StreamingReporterBase<Catch::XmlReporter>::sectionEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,sectionStats);
  iVar1 = this->m_sectionDepth + -1;
  this->m_sectionDepth = iVar1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"OverallResults",&local_49);
    Catch::operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"successes",&local_81);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)local_28,&local_80,(unsigned_long *)(e._8_8_ + 0x58));
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"failures",&local_a9);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)local_28,&local_a8,(unsigned_long *)(e._8_8_ + 0x60));
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"expectedFailures",&local_d1);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)local_28,&local_d0,(unsigned_long *)(e._8_8_ + 0x68));
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    peVar2 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
    iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"durationInSeconds",&local_f9);
      XmlWriter::ScopedElement::writeAttribute<double>
                ((ScopedElement *)local_28,&local_f8,(double *)(e._8_8_ + 0x70));
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    fmt = Catch::operator|(Newline,Indent);
    XmlWriter::endElement(&this->m_xml,fmt);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if( --m_sectionDepth > 0 ) {
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
            e.writeAttribute( "successes", sectionStats.assertions.passed );
            e.writeAttribute( "failures", sectionStats.assertions.failed );
            e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

            m_xml.endElement();
        }
    }